

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

int __thiscall LinkedObjectFile::get_label_id_for(LinkedObjectFile *this,int seg,int offset)

{
  pointer puVar1;
  __node_base_ptr p_Var2;
  pointer pLVar3;
  uint uVar4;
  int iVar5;
  _Hash_node_base _Var6;
  long *plVar7;
  uint *puVar8;
  uint uVar9;
  long *plVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  _Hash_node_base *p_Var14;
  _Hash_node_base *p_Var15;
  uint __len;
  ulong uVar16;
  uint __val;
  string __str;
  Label label;
  int local_a4;
  long *local_a0 [2];
  long local_90 [2];
  ulong local_80;
  value_type local_78;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  uVar16 = (ulong)seg;
  puVar1 = (this->label_per_seg_by_offset).
           super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->label_per_seg_by_offset).
                  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) *
           0x6db6db6db6db6db7;
  local_a4 = offset;
  if (uVar16 <= uVar11 && uVar11 - uVar16 != 0) {
    uVar11 = puVar1[uVar16]._M_h._M_bucket_count;
    uVar12 = (ulong)(long)offset % uVar11;
    p_Var2 = puVar1[uVar16]._M_h._M_buckets[uVar12];
    p_Var15 = (_Hash_node_base *)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (_Var6._M_nxt = p_Var2->_M_nxt, p_Var15 = p_Var2, *(int *)&p_Var2->_M_nxt[1]._M_nxt != offset
       )) {
      while (p_Var14 = _Var6._M_nxt, _Var6._M_nxt = p_Var14->_M_nxt,
            _Var6._M_nxt != (_Hash_node_base *)0x0) {
        p_Var15 = (_Hash_node_base *)0x0;
        if (((ulong)(long)*(int *)&_Var6._M_nxt[1]._M_nxt % uVar11 != uVar12) ||
           (p_Var15 = p_Var14, *(int *)&_Var6._M_nxt[1]._M_nxt == offset)) goto LAB_0012dea3;
      }
      p_Var15 = (_Hash_node_base *)0x0;
    }
LAB_0012dea3:
    if (p_Var15 == (_Hash_node_base *)0x0) {
      _Var6._M_nxt = (_Hash_node_base *)0x0;
    }
    else {
      _Var6._M_nxt = p_Var15->_M_nxt;
    }
    if (_Var6._M_nxt == (_Hash_node_base *)0x0) {
      iVar5 = (int)((ulong)((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar13 = iVar5 * -0x33333333;
      local_78.name._M_dataplus._M_p = (pointer)&local_78.name.field_2;
      local_78.name._M_string_length = 0;
      local_78.name.field_2._M_local_buf[0] = '\0';
      __val = iVar5 * 0x33333333;
      if ((int)__val < 0) {
        __val = uVar13;
      }
      __len = 1;
      if (9 < __val) {
        uVar11 = (ulong)__val;
        uVar4 = 4;
        do {
          __len = uVar4;
          uVar9 = (uint)uVar11;
          if (uVar9 < 100) {
            __len = __len - 2;
            goto LAB_0012dfb7;
          }
          if (uVar9 < 1000) {
            __len = __len - 1;
            goto LAB_0012dfb7;
          }
          if (uVar9 < 10000) goto LAB_0012dfb7;
          uVar11 = uVar11 / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar9);
        __len = __len + 1;
      }
LAB_0012dfb7:
      local_a0[0] = local_90;
      local_80 = uVar16;
      local_78.target_segment = seg;
      local_78.offset = offset;
      std::__cxx11::string::_M_construct((ulong)local_a0,(char)__len - (char)((int)uVar13 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar13 >> 0x1f) + (long)local_a0[0]),__len,__val);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x148653);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_40 = *plVar10;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar10;
        local_50 = (long *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      uVar11 = local_80;
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      puVar1 = (this->label_per_seg_by_offset).
               super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(this->label_per_seg_by_offset).
                      super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) *
               0x6db6db6db6db6db7;
      if (uVar12 < uVar11 || uVar12 - uVar11 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      puVar8 = (uint *)std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)(puVar1 + uVar16),&local_a4);
      *puVar8 = uVar13;
      std::vector<Label,_std::allocator<Label>_>::push_back(&this->labels,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
        operator_delete(local_78.name._M_dataplus._M_p,
                        CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                                 local_78.name.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      uVar13 = *(uint *)((long)(_Var6._M_nxt + 1) + 4);
      uVar16 = (ulong)(int)uVar13;
      pLVar3 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) * -0x3333333333333333;
      if (uVar11 < uVar16 || uVar11 - uVar16 == 0) goto LAB_0012e12b;
      if (pLVar3[uVar16].offset != offset) {
        __assert_fail("label.offset == offset",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x34,"int LinkedObjectFile::get_label_id_for(int, int)");
      }
      if (pLVar3[uVar16].target_segment != seg) {
        __assert_fail("label.target_segment == seg",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x35,"int LinkedObjectFile::get_label_id_for(int, int)");
      }
    }
    return uVar13;
  }
LAB_0012e12b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16);
}

Assistant:

int LinkedObjectFile::get_label_id_for(int seg, int offset) {
  auto kv = label_per_seg_by_offset.at(seg).find(offset);
  if (kv == label_per_seg_by_offset.at(seg).end()) {
    // create a new label
    int id = labels.size();
    Label label;
    label.target_segment = seg;
    label.offset = offset;
    label.name = "L" + std::to_string(id);
    label_per_seg_by_offset.at(seg)[offset] = id;
    labels.push_back(label);
    return id;
  } else {
    // return an existing label
    auto& label = labels.at(kv->second);
    assert(label.offset == offset);
    assert(label.target_segment == seg);
    return kv->second;
  }
}